

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::RandCaseStatementSyntax::setChild
          (RandCaseStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004836dc + *(int *)(&DAT_004836dc + index * 4)))();
  return;
}

Assistant:

void RandCaseStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: randCase = child.token(); return;
        case 3: items = child.node()->as<SyntaxList<RandCaseItemSyntax>>(); return;
        case 4: endCase = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}